

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O0

char * growl_sound(monst *mtmp)

{
  char *local_18;
  char *ret;
  monst *mtmp_local;
  
  switch(mtmp->data->msound) {
  case '\0':
    local_18 = "commotion";
    break;
  case '\x01':
  case '\x04':
    local_18 = "growl";
    break;
  case '\x02':
  case '\a':
    local_18 = "hiss";
    break;
  case '\x03':
    local_18 = "roar";
    break;
  case '\x05':
    local_18 = "squeal";
    break;
  case '\x06':
    local_18 = "screech";
    break;
  case '\b':
    local_18 = "buzz";
    break;
  default:
    local_18 = "scream";
    break;
  case '\n':
    local_18 = "neigh";
    break;
  case '\v':
    local_18 = "wail";
  }
  return local_18;
}

Assistant:

const char *growl_sound(struct monst *mtmp)
{
	const char *ret;

	switch (mtmp->data->msound) {
	case MS_MEW:
	case MS_HISS:
	    ret = "hiss";
	    break;
	case MS_BARK:
	case MS_GROWL:
	    ret = "growl";
	    break;
	case MS_ROAR:
	    ret = "roar";
	    break;
	case MS_BUZZ:
	    ret = "buzz";
	    break;
	case MS_SQEEK:
	    ret = "squeal";
	    break;
	case MS_SQAWK:
	    ret = "screech";
	    break;
	case MS_NEIGH:
	    ret = "neigh";
	    break;
	case MS_WAIL:
	    ret = "wail";
	    break;
	case MS_SILENT:
		ret = "commotion";
		break;
	default:
		ret = "scream";
	}
	return ret;
}